

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall google::protobuf::internal::DynamicMapField::Clear(DynamicMapField *this)

{
  bool bVar1;
  iterator *in_RDI;
  MapValueRef *in_stack_00000010;
  iterator iter;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  iterator *in_stack_ffffffffffffffc0;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_ffffffffffffffe0;
  
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin(in_stack_ffffffffffffffe0);
  while( true ) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end(in_stack_ffffffffffffffe0);
    bVar1 = protobuf::operator!=(in_stack_ffffffffffffffc0,in_RDI);
    if (!bVar1) break;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
              ((iterator *)0x434198);
    MapValueRef::DeleteData(in_stack_00000010);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator++
              (in_stack_ffffffffffffffc0);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear
            ((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)iter.it_.node_);
  if ((in_RDI->it_).bucket_index_ != 0) {
    RepeatedPtrField<google::protobuf::Message>::Clear
              ((RepeatedPtrField<google::protobuf::Message> *)0x4341d2);
  }
  MapFieldBase::SetMapDirty((MapFieldBase *)0x4341db);
  return;
}

Assistant:

void DynamicMapField::Clear() {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();

  if (MapFieldBase::repeated_field_ != nullptr) {
    MapFieldBase::repeated_field_->Clear();
  }
  // Data in map and repeated field are both empty, but we can't set status
  // CLEAN which will invalidate previous reference to map.
  MapFieldBase::SetMapDirty();
}